

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_io.cpp
# Opt level: O3

int main(void)

{
  MakeNet *pMVar1;
  code *__nbytes;
  void *__buf;
  initializer_list<unsigned_long> __l;
  Net mlp_copy;
  Net mlp;
  stringstream ss;
  PlainTextNetworkWriter local_240;
  undefined1 local_238 [16];
  pointer local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_200;
  code *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  undefined1 local_1c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined1 local_198 [16];
  pointer local_188;
  pointer pMStack_180;
  pointer local_178;
  pointer pLStack_170;
  pointer local_168;
  pointer pLStack_160;
  bool local_158;
  ios_base local_118 [272];
  
  local_168 = (pointer)0x0;
  pLStack_160 = (pointer)0x0;
  local_178 = (pointer)0x0;
  pLStack_170 = (pointer)0x0;
  local_188 = (pointer)0x0;
  pMStack_180 = (pointer)0x0;
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_158 = false;
  local_238._0_8_ = (ostream *)0x2;
  local_238._8_8_ = (pointer)0x2;
  local_228 = (pointer)0x1;
  __l._M_len = 3;
  __l._M_array = (iterator)local_238;
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_200,__l,(allocator_type *)&local_240);
  pMVar1 = notch::core::MakeNet::MultilayerPerceptron
                     ((MakeNet *)local_198,&local_200,(Activation *)notch::core::scaledTanh);
  pMVar1 = notch::core::MakeNet::addLoss(pMVar1,L2Loss);
  local_1e0 = 0;
  local_1e8 = notch::core::Init::normalXavier;
  local_1d0 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  __nbytes = notch::core::std::
             _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
             ::_M_manager;
  local_1d8 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)local_1c8,(EVP_PKEY_CTX *)pMVar1);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,3);
  }
  if (local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (pLStack_170 != (pointer)0x0) {
    operator_delete(pLStack_170);
  }
  notch::core::std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::~vector
            ((vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_> *)&local_188);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  local_238._0_8_ = (ostream *)&local_188;
  notch::io::PlainTextNetworkWriter::save((PlainTextNetworkWriter *)local_238,(Net *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"saved:\n\n```\n",0xc);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_238._0_8_,local_238._8_8_);
  if ((ostream *)local_238._0_8_ != (ostream *)&local_228) {
    operator_delete((void *)local_238._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"```\n\n",5);
  std::istream::seekg((ostream *)local_198,0,0);
  local_240.out = (ostream *)local_198;
  notch::io::PlainTextNetworkReader::read
            ((PlainTextNetworkReader *)local_238,(int)&local_240,__buf,(size_t)__nbytes);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"loaded:\n\n```\n",0xd);
  local_240.out = (ostream *)&std::cout;
  notch::io::PlainTextNetworkWriter::save(&local_240,(Net *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"```\n\n",5);
  local_238._0_8_ = &PTR_append_0011e690;
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    notch::core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  notch::core::std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::~vector((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             *)(local_238 + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  local_1c8._0_8_ = &PTR_append_0011e690;
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    notch::core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  notch::core::std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::~vector((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             *)(local_1c8 + 8));
  return 0;
}

Assistant:

int main() {

    // create a multilayer perceptron and save it to a string stream
    Net mlp = MakeNet().MultilayerPerceptron({2, 2, 1}).addL2Loss().init();
    stringstream ss;
    PlainTextNetworkWriter(ss) << mlp;

    // show original
    cout << "saved:\n\n```\n";
    cout << ss.str();
    cout << "```\n\n";

    // read a copy of the multilayer perceptron from the string stream
    ss.seekg(0);
    Net mlp_copy = PlainTextNetworkReader(ss).read();

    // show a copy
    cout << "loaded:\n\n```\n";
    PlainTextNetworkWriter(cout) << mlp_copy;
    cout << "```\n\n";
}